

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

boxptr find_biggest_color_pop(boxptr boxlist,int numboxes)

{
  boxptr local_38;
  boxptr which;
  long maxc;
  boxptr pbStack_20;
  int i;
  boxptr boxp;
  int numboxes_local;
  boxptr boxlist_local;
  
  which = (boxptr)0x0;
  local_38 = (boxptr)0x0;
  pbStack_20 = boxlist;
  for (maxc._4_4_ = 0; maxc._4_4_ < numboxes; maxc._4_4_ = maxc._4_4_ + 1) {
    if (((long)which < pbStack_20->colorcount) && (0 < pbStack_20->volume)) {
      local_38 = pbStack_20;
      which = (boxptr)pbStack_20->colorcount;
    }
    pbStack_20 = pbStack_20 + 1;
  }
  return local_38;
}

Assistant:

LOCAL(boxptr)
find_biggest_color_pop (boxptr boxlist, int numboxes)
/* Find the splittable box with the largest color population */
/* Returns NULL if no splittable boxes remain */
{
  register boxptr boxp;
  register int i;
  register long maxc = 0;
  boxptr which = NULL;
  
  for (i = 0, boxp = boxlist; i < numboxes; i++, boxp++) {
    if (boxp->colorcount > maxc && boxp->volume > 0) {
      which = boxp;
      maxc = boxp->colorcount;
    }
  }
  return which;
}